

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O0

void generateData(char *dataDir,char *bundleName)

{
  FILE *__stream;
  uint length;
  uint32_t uVar1;
  uint32_t uVar2;
  size_t sVar3;
  char *pcVar4;
  char *comment;
  int32_t sprepTrieSize;
  char *fileName;
  int32_t dataLength;
  int32_t size;
  UErrorCode errorCode;
  UNewDataMemory *pData;
  char *bundleName_local;
  char *dataDir_local;
  
  dataLength = 0;
  pData = (UNewDataMemory *)bundleName;
  bundleName_local = dataDir;
  sVar3 = strlen(bundleName);
  pcVar4 = (char *)uprv_malloc_63(sVar3 + 100);
  storeMappingData();
  length = utrie_serialize_63(sprepTrie,generateData::sprepTrieBlock,100000,getFoldedValue,'\x01',
                              &dataLength);
  __stream = _stderr;
  if (0 < dataLength) {
    pcVar4 = u_errorName_63(dataLength);
    fprintf(__stream,"error: utrie_serialize(sprep trie) failed, %s\n",pcVar4);
    exit(dataLength);
  }
  uVar1 = length + mappingDataCapacity * 2 + 0x40;
  if (beVerbose != '\0') {
    printf("size of sprep trie              %5u bytes\n",(ulong)length);
    printf("size of icudt63l_%s.spp contents: %ld bytes\n",pData,(long)(int)uVar1);
    printf("size of mapping data array %5u bytes\n",(ulong)(uint)(mappingDataCapacity << 1));
    printf("Number of code units in mappingData (currentIndex) are: %i \n",
           (ulong)(uint)(int)currentIndex);
    printf("Maximum length of the mapping string is : %i \n",(ulong)(uint)maxLength);
  }
  *pcVar4 = '\0';
  strcat(pcVar4,(char *)pData);
  comment = (char *)0x0;
  if (haveCopyright != '\0') {
    comment = 
    " Copyright (C) 2016 and later: Unicode, Inc. and others. License & terms of use: http://www.unicode.org/copyright.html "
    ;
  }
  _size = udata_create(bundleName_local,"spp",pcVar4,&dataInfo,comment,&dataLength);
  if (0 < dataLength) {
    fprintf(_stderr,"gensprep: unable to create the output file, error %d\n",(ulong)(uint)dataLength
           );
    exit(dataLength);
  }
  indexes[1] = mappingDataCapacity << 1;
  indexes[0] = length;
  udata_writeBlock(_size,indexes,0x40);
  udata_writeBlock(_size,generateData::sprepTrieBlock,length);
  udata_writeBlock(_size,mappingData,indexes[1]);
  uVar2 = udata_finish(_size,&dataLength);
  if (0 < dataLength) {
    fprintf(_stderr,"gensprep: error %d writing the output file\n",(ulong)(uint)dataLength);
    exit(dataLength);
  }
  if (uVar2 != uVar1) {
    fprintf(_stderr,"gensprep error: data length %ld != calculated size %ld\n",(long)(int)uVar2,
            (long)(int)uVar1);
    exit(5);
  }
  if (hashTable != (UHashtable *)0x0) {
    uhash_close_63(hashTable);
  }
  uprv_free_63(pcVar4);
  return;
}

Assistant:

extern void
generateData(const char *dataDir, const char* bundleName) {
    static uint8_t sprepTrieBlock[100000];

    UNewDataMemory *pData;
    UErrorCode errorCode=U_ZERO_ERROR;
    int32_t size, dataLength;
    char* fileName = (char*) uprv_malloc(uprv_strlen(bundleName) +100);

#if UCONFIG_NO_IDNA

    size=0;

#else

    int32_t sprepTrieSize;

    /* sort and add mapping data */
    storeMappingData();
    
    sprepTrieSize=utrie_serialize(sprepTrie, sprepTrieBlock, sizeof(sprepTrieBlock), getFoldedValue, TRUE, &errorCode);
    if(U_FAILURE(errorCode)) {
        fprintf(stderr, "error: utrie_serialize(sprep trie) failed, %s\n", u_errorName(errorCode));
        exit(errorCode);
    }
    
    size = sprepTrieSize + mappingDataCapacity*U_SIZEOF_UCHAR + sizeof(indexes);
    if(beVerbose) {
        printf("size of sprep trie              %5u bytes\n", (int)sprepTrieSize);
        printf("size of " U_ICUDATA_NAME "_%s." DATA_TYPE " contents: %ld bytes\n", bundleName,(long)size);
        printf("size of mapping data array %5u bytes\n",(int)mappingDataCapacity * U_SIZEOF_UCHAR);
        printf("Number of code units in mappingData (currentIndex) are: %i \n", currentIndex);
        printf("Maximum length of the mapping string is : %i \n", (int)maxLength);
    }

#endif

    fileName[0]=0;
    uprv_strcat(fileName,bundleName);
    /* write the data */
    pData=udata_create(dataDir, DATA_TYPE, fileName, &dataInfo,
                       haveCopyright ? U_COPYRIGHT_STRING : NULL, &errorCode);
    if(U_FAILURE(errorCode)) {
        fprintf(stderr, "gensprep: unable to create the output file, error %d\n", errorCode);
        exit(errorCode);
    }

#if !UCONFIG_NO_IDNA

    indexes[_SPREP_INDEX_TRIE_SIZE]=sprepTrieSize;
    indexes[_SPREP_INDEX_MAPPING_DATA_SIZE]=mappingDataCapacity*U_SIZEOF_UCHAR;
    
    udata_writeBlock(pData, indexes, sizeof(indexes));
    udata_writeBlock(pData, sprepTrieBlock, sprepTrieSize);
    udata_writeBlock(pData, mappingData, indexes[_SPREP_INDEX_MAPPING_DATA_SIZE]);
    

#endif

    /* finish up */
    dataLength=udata_finish(pData, &errorCode);
    if(U_FAILURE(errorCode)) {
        fprintf(stderr, "gensprep: error %d writing the output file\n", errorCode);
        exit(errorCode);
    }

    if(dataLength!=size) {
        fprintf(stderr, "gensprep error: data length %ld != calculated size %ld\n",
            (long)dataLength, (long)size);
        exit(U_INTERNAL_PROGRAM_ERROR);
    }

#if !UCONFIG_NO_IDNA
    /* done with writing the data .. close the hashtable */
    if (hashTable != NULL) {
        uhash_close(hashTable);
    }
#endif

    uprv_free(fileName);
}